

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

unsigned_short gpu::deviceTypeMin<unsigned_short>(void)

{
  uint16_t uVar1;
  Type TVar2;
  gpu_exception *this;
  undefined1 local_20 [8];
  Context context;
  
  Context::Context((Context *)local_20);
  TVar2 = Context::type((Context *)local_20);
  if (TVar2 == TypeOpenCL) {
    uVar1 = ocl::OpenCLType<unsigned_short>::min();
    Context::~Context((Context *)local_20);
    return uVar1;
  }
  this = (gpu_exception *)__cxa_allocate_exception(0x10);
  gpu_exception::gpu_exception(this,"No GPU active context!");
  __cxa_throw(this,&gpu_exception::typeinfo,gpu_exception::~gpu_exception);
}

Assistant:

T gpu::deviceTypeMin() {
	Context context;
#ifdef CUDA_SUPPORT
	if (context.type() == Context::TypeCUDA) {
		return std::numeric_limits<T>::min();
	} else
#endif
	if (context.type() == Context::TypeOpenCL) {
		return ocl::OpenCLType<T>::min();
	} else {
		throw gpu_exception("No GPU active context!");
	}
}